

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O0

Vector3d * ins_ekf::QuatToRPY(Vector3d *__return_storage_ptr__,Vector4d *quat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  double local_58;
  double yaw;
  double cy_cp;
  double sy_cp;
  double pitch;
  double sp;
  double roll;
  double cr_cp;
  double sr_cp;
  Vector4d *quat_local;
  Vector3d *rpy;
  
  sr_cp = (double)quat;
  quat_local = (Vector4d *)__return_storage_ptr__;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)quat,3);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,0);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,2);
  cr_cp = (dVar1 * dVar2 + dVar3 * *pdVar4) * 2.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,0);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,0);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar1 = dVar1 * dVar2 + dVar3 * *pdVar4;
  roll = 1.0 - (dVar1 + dVar1);
  sp = atan2(cr_cp,roll);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,3);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,2);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,0);
  pitch = (dVar1 * dVar2 + -(dVar3 * *pdVar4)) * 2.0;
  sy_cp = 0.0;
  if (ABS(pitch) <= 0.98) {
    sy_cp = asin(pitch);
  }
  else {
    sy_cp = (double)(~-(ulong)(0.0 < pitch) & 0xbff921fb54442d18 |
                    -(ulong)(0.0 < pitch) & 0x3ff921fb54442d18);
  }
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,3);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,2);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,0);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  cy_cp = (dVar1 * dVar2 + dVar3 * *pdVar4) * 2.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,1);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,2);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)sr_cp,2);
  dVar1 = dVar1 * dVar2 + dVar3 * *pdVar4;
  yaw = 1.0 - (dVar1 + dVar1);
  local_58 = atan2(cy_cp,yaw);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__,&sp,&sy_cp,&local_58);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d QuatToRPY(const Eigen::Vector4d& quat){

        // roll (body x axis)
        double sr_cp = 2.0 * (quat[3] * quat[0] + quat[1] * quat[2]);
        double cr_cp = 1.0 - 2.0 * (quat[0] * quat[0] + quat[1] * quat[1]);
        double roll = atan2(sr_cp, cr_cp);

        // pitch (y axis of pre-roll frame)
        double sp = 2.0 * (quat[3] * quat[1] - quat[2] * quat[0]);
        double pitch = 0.0;
        if (std::fabs(sp) > 0.98) // unlikely to be vertical pitch
            pitch = sp > 0 ? M_PI_2 : -M_PI_2;
        else
            pitch = asin(sp);

        // yaw (inertial frame z axis)
        double sy_cp = 2.0 * (quat[3] * quat[2] + quat[0] * quat[1]);
        double cy_cp = 1.0 - 2.0 * (quat[1] * quat[1] + quat[2] * quat[2]);
        double yaw = atan2(sy_cp, cy_cp);

        Eigen::Vector3d rpy {roll, pitch, yaw};

        return rpy;
    }